

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotMap.c
# Opt level: O1

void destroyPath(Path *path)

{
  TileNode *__ptr;
  uint uVar1;
  TileNode *pTVar2;
  
  if (path->count == 0) {
    pTVar2 = (TileNode *)0x0;
  }
  else {
    pTVar2 = path->first;
  }
  if (path->count != 0) {
    uVar1 = 0;
    do {
      while (__ptr = pTVar2->next, __ptr != (TileNode *)0x0) {
        free(__ptr);
        path->count = path->count - 1;
        pTVar2 = __ptr;
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < path->count);
  }
  free(path);
  return;
}

Assistant:

void destroyPath(struct Path *path) {
    struct TileNode *nextNode = NULL;

    if (path->count > 0)
        nextNode = path->first;

    for (int i = 0; i < path->count; i++) {
        while (nextNode->next != NULL) {
            nextNode = nextNode->next;
            free(nextNode);
            path->count--;
        }
    }
    free(path);
}